

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cc
# Opt level: O1

Matrix * __thiscall sptk::Matrix::operator-(Matrix *__return_storage_ptr__,Matrix *this)

{
  pointer pdVar1;
  pointer pdVar2;
  
  Matrix(__return_storage_ptr__,this);
  pdVar1 = (__return_storage_ptr__->data_).super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (pdVar2 = (__return_storage_ptr__->data_).super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_start; pdVar2 != pdVar1; pdVar2 = pdVar2 + 1) {
    *pdVar2 = -*pdVar2;
  }
  return __return_storage_ptr__;
}

Assistant:

Matrix Matrix::operator-() const {
  Matrix result(*this);
  result.Negate();
  return result;
}